

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

DecodePsbtResponseStruct * __thiscall
cfd::api::json::DecodePsbtResponse::ConvertToStruct(DecodePsbtResponse *this)

{
  long in_RSI;
  DecodePsbtResponseStruct *in_RDI;
  JsonObjectVector<cfd::api::json::DecodePsbtOutput,_DecodePsbtOutputStruct> *in_stack_00000048;
  DecodePsbtResponseStruct *result;
  JsonObjectVector<cfd::api::json::DecodePsbtInput,_DecodePsbtInputStruct> *in_stack_000002c8;
  DecodeRawTransactionResponseStruct *in_stack_fffffffffffffe78;
  DecodeRawTransactionResponseStruct *in_stack_fffffffffffffe80;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_> *in_stack_fffffffffffffe88;
  vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_> *__x;
  vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_> *in_stack_fffffffffffffe90;
  vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_> *this_01;
  DecodePsbtResponseStruct *pDVar1;
  pointer in_stack_fffffffffffffee8;
  vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_> local_110 [3];
  JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct> *in_stack_ffffffffffffff38;
  JsonObjectVector<cfd::api::json::PsbtGlobalXpub,_PsbtGlobalXpubStruct> *in_stack_ffffffffffffffc8;
  
  pDVar1 = in_RDI;
  DecodePsbtResponseStruct::DecodePsbtResponseStruct(in_RDI);
  DecodeRawTransactionResponse::ConvertToStruct
            ((DecodeRawTransactionResponse *)in_stack_fffffffffffffee8);
  DecodeRawTransactionResponseStruct::operator=(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78)
  ;
  DecodeRawTransactionResponseStruct::~DecodeRawTransactionResponseStruct(in_stack_fffffffffffffe80)
  ;
  std::__cxx11::string::operator=((string *)&in_RDI->tx_hex,(string *)(in_RSI + 0x108));
  core::JsonObjectVector<cfd::api::json::PsbtGlobalXpub,_PsbtGlobalXpubStruct>::ConvertToStruct
            (in_stack_ffffffffffffffc8);
  std::vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>::operator=
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  std::vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>::~vector
            (in_stack_fffffffffffffe90);
  in_RDI->version = *(uint32_t *)(in_RSI + 0x148);
  core::JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct>::ConvertToStruct
            (in_stack_ffffffffffffff38);
  this_01 = local_110;
  std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>::operator=
            ((vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)this_01,
             (vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)
             in_stack_fffffffffffffe88);
  std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>::~vector
            ((vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)this_01);
  core::JsonObjectVector<cfd::api::json::DecodePsbtInput,_DecodePsbtInputStruct>::ConvertToStruct
            (in_stack_000002c8);
  __x = (vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_> *)
        &stack0xfffffffffffffed8;
  std::vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>::operator=(this_01,__x)
  ;
  std::vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>::~vector(this_01);
  core::JsonObjectVector<cfd::api::json::DecodePsbtOutput,_DecodePsbtOutputStruct>::ConvertToStruct
            (in_stack_00000048);
  this_00 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffec0;
  std::vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>::operator=
            ((vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_> *)this_01,
             (vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_> *)__x);
  std::vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>::~vector
            ((vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_> *)this_01);
  in_RDI->fee = *(int64_t *)(in_RSI + 0x1b0);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(this_00,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffe78);
  return pDVar1;
}

Assistant:

DecodePsbtResponseStruct DecodePsbtResponse::ConvertToStruct() const {  // NOLINT
  DecodePsbtResponseStruct result;
  result.tx = tx_.ConvertToStruct();
  result.tx_hex = tx_hex_;
  result.xpubs = xpubs_.ConvertToStruct();
  result.version = version_;
  result.unknown = unknown_.ConvertToStruct();
  result.inputs = inputs_.ConvertToStruct();
  result.outputs = outputs_.ConvertToStruct();
  result.fee = fee_;
  result.ignore_items = ignore_items;
  return result;
}